

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_set_timeout(pcap_t *p,int timeout_ms)

{
  int iVar1;
  int timeout_ms_local;
  pcap_t *p_local;
  
  iVar1 = pcap_check_activated(p);
  if (iVar1 == 0) {
    (p->opt).timeout = timeout_ms;
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = -4;
  }
  return p_local._4_4_;
}

Assistant:

int
pcap_set_timeout(pcap_t *p, int timeout_ms)
{
	if (pcap_check_activated(p))
#ifdef _WIN32
		if (p->opt.timeout != timeout_ms)
			if (PacketSetReadTimeout(p->adapter, p->opt.timeout))
				return 0;
			else
				return PCAP_ERROR;
#else
		return (PCAP_ERROR_ACTIVATED);
#endif
	p->opt.timeout = timeout_ms;
	return (0);
}